

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void ghc::filesystem::copy_symlink(path *existing_symlink,path *new_symlink,error_code *ec)

{
  bool bVar1;
  path to;
  path pStack_38;
  
  std::error_code::clear(ec);
  read_symlink(&pStack_38,existing_symlink,ec);
  if (ec->_M_value == 0) {
    bVar1 = exists(&pStack_38,ec);
    if (bVar1) {
      bVar1 = is_directory(&pStack_38,ec);
      if (bVar1) {
        create_directory_symlink(&pStack_38,new_symlink,ec);
        goto LAB_0014c20b;
      }
    }
    create_symlink(&pStack_38,new_symlink,ec);
  }
LAB_0014c20b:
  std::__cxx11::string::~string((string *)&pStack_38);
  return;
}

Assistant:

GHC_INLINE void copy_symlink(const path& existing_symlink, const path& new_symlink, std::error_code& ec) noexcept
{
    ec.clear();
    auto to = read_symlink(existing_symlink, ec);
    if (!ec) {
        if (exists(to, ec) && is_directory(to, ec)) {
            create_directory_symlink(to, new_symlink, ec);
        }
        else {
            create_symlink(to, new_symlink, ec);
        }
    }
}